

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::Add
          (EncodedDescriptorDatabase *this,void *encoded_file_descriptor,int size)

{
  bool bVar1;
  LogMessage *other;
  MessageLite *in_RDI;
  FileDescriptorProto file;
  int *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined8 in_stack_fffffffffffffe68;
  LogLevel_conflict level;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  void *in_stack_fffffffffffffe78;
  FileDescriptorProto *in_stack_fffffffffffffeb0;
  undefined1 local_1;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  FileDescriptorProto::FileDescriptorProto(in_stack_fffffffffffffeb0);
  bVar1 = MessageLite::ParseFromArray(in_RDI,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  if (bVar1) {
    std::make_pair<void_const*&,int&>
              ((void **)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe67 =
         SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::AddFile
                   ((DescriptorIndex<std::pair<const_void_*,_int>_> *)
                    file.dependency_.super_RepeatedPtrFieldBase.arena_,
                    (FileDescriptorProto *)file._16_8_,
                    (pair<const_void_*,_int>)file.dependency_.super_RepeatedPtrFieldBase._8_16_);
    local_1 = (bool)in_stack_fffffffffffffe67;
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),level,
               (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    other = internal::LogMessage::operator<<
                      ((LogMessage *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                       (char *)in_stack_fffffffffffffe58);
    internal::LogFinisher::operator=
              ((LogFinisher *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),other);
    internal::LogMessage::~LogMessage((LogMessage *)0x52fa45);
    local_1 = false;
  }
  FileDescriptorProto::~FileDescriptorProto
            ((FileDescriptorProto *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  return local_1;
}

Assistant:

bool EncodedDescriptorDatabase::Add(const void* encoded_file_descriptor,
                                    int size) {
  FileDescriptorProto file;
  if (file.ParseFromArray(encoded_file_descriptor, size)) {
    return index_.AddFile(file, std::make_pair(encoded_file_descriptor, size));
  } else {
    GOOGLE_LOG(ERROR) << "Invalid file descriptor data passed to "
                  "EncodedDescriptorDatabase::Add().";
    return false;
  }
}